

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,wstring *out)

{
  byte *in;
  pointer puVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  size_t cbIn;
  pointer cbIn_00;
  ObjectIdentifier *pOVar5;
  pointer puVar6;
  undefined1 local_90 [8];
  wstring tmp;
  unsigned_long node;
  pointer local_28;
  size_t cbRead;
  
  pOVar5 = this;
  pcVar4 = GetOidString(this);
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,pcVar4,(allocator *)&node);
    utf8ToUtf16((wstring *)local_90,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::wstring::operator=((wstring *)out,(wstring *)local_90);
    std::__cxx11::wstring::~wstring((wstring *)local_90);
    pOVar5 = (ObjectIdentifier *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)pOVar5);
  }
  local_90 = (undefined1  [8])&tmp._M_string_length;
  tmp._M_dataplus._M_p = (pointer)0x0;
  tmp._M_string_length._0_4_ = 0;
  local_28 = (pointer)0x0;
  tmp.field_2._8_8_ = 0;
  in = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  cbIn = (long)(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)in;
  if (cbIn == 0) {
LAB_0012b7a2:
    bVar3 = false;
    goto LAB_0012b7a4;
  }
  if (*in < 0x28) {
    std::__cxx11::wstring::assign((wchar_t *)local_90);
    std::__cxx11::to_wstring
              ((wstring *)&node,
               (uint)*(this->value).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &stack0xffffffffffffffb8,L".",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &node);
    std::__cxx11::wstring::append((wstring *)local_90);
LAB_0012b67a:
    std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffb8);
    pOVar5 = (ObjectIdentifier *)&node;
    std::__cxx11::wstring::~wstring((wstring *)pOVar5);
    local_28 = (pointer)0x1;
    puVar6 = (pointer)0x1;
  }
  else {
    if (*in < 0x50) {
      std::__cxx11::wstring::assign((wchar_t *)local_90);
      std::__cxx11::to_wstring
                ((wstring *)&node,
                 *(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start - 0x28);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &stack0xffffffffffffffb8,L".",
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &node);
      std::__cxx11::wstring::append((wstring *)local_90);
      goto LAB_0012b67a;
    }
    bVar3 = DecodeLong(pOVar5,in,cbIn,(unsigned_long *)(tmp.field_2._M_local_buf + 2),
                       (size_t *)&stack0xffffffffffffffd8);
    uVar2 = tmp.field_2._8_8_;
    if ((ulong)tmp.field_2._8_8_ < 0x50 || !bVar3) goto LAB_0012b7a2;
    std::__cxx11::wstring::assign((wchar_t *)local_90);
    std::__cxx11::to_wstring((wstring *)&node,uVar2 - 0x50);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &stack0xffffffffffffffb8,L".",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &node);
    std::__cxx11::wstring::append((wstring *)local_90);
    std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffb8);
    pOVar5 = (ObjectIdentifier *)&node;
    std::__cxx11::wstring::~wstring((wstring *)pOVar5);
    puVar6 = local_28;
  }
  while( true ) {
    puVar1 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    cbIn_00 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish + -(long)puVar1;
    if (cbIn_00 <= puVar6) break;
    bVar3 = DecodeLong(pOVar5,puVar6 + (long)puVar1,(size_t)cbIn_00,
                       (unsigned_long *)(tmp.field_2._M_local_buf + 2),
                       (size_t *)&stack0xffffffffffffffd8);
    if (!bVar3) goto LAB_0012b7a2;
    std::__cxx11::to_wstring((wstring *)&node,tmp.field_2._8_8_);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &stack0xffffffffffffffb8,L".",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &node);
    std::__cxx11::wstring::append((wstring *)local_90);
    std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffb8);
    pOVar5 = (ObjectIdentifier *)&node;
    std::__cxx11::wstring::~wstring((wstring *)pOVar5);
    puVar6 = puVar6 + (long)local_28;
  }
  std::__cxx11::wstring::swap((wstring *)out);
  bVar3 = true;
LAB_0012b7a4:
  std::__cxx11::wstring::~wstring((wstring *)local_90);
  return bVar3;
}

Assistant:

bool ObjectIdentifier::ToString(std::wstring & out) const
{
	// If possible, just look it up in our table
	const char* szOid = this->GetOidString();

	if (szOid != nullptr)
		out = utf8ToUtf16(szOid);

	std::wstring tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
		return false;

	if (value[0] < 40)
	{
		tmp = L"0";
		tmp += L"." + std::to_wstring(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = L"1";
		tmp += L"." + std::to_wstring(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = L"2";
		tmp += L"." + std::to_wstring(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += L"." + std::to_wstring(node);
	}

	out.swap(tmp);
	return true;
}